

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Vec_Ptr_t * Gia_ManMiterNames(Vec_Ptr_t *p,int nOuts)

{
  ulong uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  char pBuffer [1000];
  char *local_428;
  char local_418 [1000];
  
  iVar9 = p->nSize;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  uVar10 = 8;
  if (6 < (iVar9 - nOuts / 2) - 1U) {
    uVar10 = (ulong)(uint)(iVar9 - nOuts / 2);
  }
  pVVar3->nSize = 0;
  iVar8 = (int)uVar10;
  pVVar3->nCap = iVar8;
  if (iVar8 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar8 << 3);
  }
  pVVar3->pArray = ppvVar4;
  if ((nOuts & 1U) == 0) {
    if (nOuts <= iVar9) {
      if ((iVar9 < 2) || (nOuts == 0)) {
        lVar11 = 0;
        uVar2 = 0;
      }
      else {
        lVar11 = 0;
        uVar12 = 2;
        do {
          sprintf(local_418,"%s_xor_%s",p->pArray[uVar12 - 2],p->pArray[uVar12 - 1]);
          sVar5 = strlen(local_418);
          pcVar6 = (char *)malloc(sVar5 + 1);
          strcpy(pcVar6,local_418);
          iVar9 = (int)uVar10;
          if ((int)lVar11 == iVar9) {
            if (iVar9 < 0x10) {
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
              }
              pVVar3->pArray = ppvVar4;
              pVVar3->nCap = 0x10;
              uVar10 = 0x10;
            }
            else {
              uVar10 = (ulong)(uint)(iVar9 * 2);
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(uVar10 * 8);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar3->pArray,uVar10 * 8);
              }
              pVVar3->pArray = ppvVar4;
              pVVar3->nCap = iVar9 * 2;
            }
          }
          else {
            ppvVar4 = pVVar3->pArray;
          }
          lVar11 = lVar11 + 1;
          pVVar3->nSize = (int)lVar11;
          *(char **)((long)ppvVar4 + uVar12 * 4 + -8) = pcVar6;
          iVar9 = p->nSize;
          uVar1 = uVar12 + 2;
        } while (((int)uVar12 + 1 < iVar9) &&
                (bVar13 = (uint)nOuts != uVar12, uVar12 = uVar1, bVar13));
        uVar2 = (int)uVar1 - 2;
      }
      if ((int)uVar2 < iVar9) {
        uVar12 = (ulong)uVar2;
        uVar2 = (int)lVar11 * 2;
        sVar5 = lVar11 << 4;
        do {
          pcVar6 = (char *)p->pArray[uVar12];
          if (pcVar6 == (char *)0x0) {
            local_428 = (char *)0x0;
          }
          else {
            sVar7 = strlen(pcVar6);
            local_428 = (char *)malloc(sVar7 + 1);
            strcpy(local_428,pcVar6);
          }
          if ((int)lVar11 == (int)uVar10) {
            ppvVar4 = pVVar3->pArray;
            if (lVar11 < 0x10) {
              if (ppvVar4 == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(ppvVar4,0x80);
              }
              pVVar3->pArray = ppvVar4;
              uVar10 = 0x10;
            }
            else {
              if (ppvVar4 == (void **)0x0) {
                ppvVar4 = (void **)malloc(sVar5);
              }
              else {
                ppvVar4 = (void **)realloc(ppvVar4,sVar5);
              }
              pVVar3->pArray = ppvVar4;
              uVar10 = (ulong)uVar2;
            }
          }
          else {
            ppvVar4 = pVVar3->pArray;
          }
          ppvVar4[lVar11] = local_428;
          lVar11 = lVar11 + 1;
          uVar12 = uVar12 + 1;
          uVar2 = uVar2 + 2;
          sVar5 = sVar5 + 0x10;
        } while ((int)uVar12 < p->nSize);
        pVVar3->nSize = (int)lVar11;
        pVVar3->nCap = (int)uVar10;
      }
      return pVVar3;
    }
    __assert_fail("nOuts <= Vec_PtrSize(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xb58,"Vec_Ptr_t *Gia_ManMiterNames(Vec_Ptr_t *, int)");
  }
  __assert_fail("nOuts % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0xb57,"Vec_Ptr_t *Gia_ManMiterNames(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Ptr_t * Gia_ManMiterNames( Vec_Ptr_t * p, int nOuts )
{
    char * pName1, * pName2, pBuffer[1000]; int i;
    Vec_Ptr_t * pNew = Vec_PtrAlloc( Vec_PtrSize(p) - nOuts/2 );
    assert( nOuts % 2 == 0 );
    assert( nOuts <= Vec_PtrSize(p) );
    Vec_PtrForEachEntryDouble( char *, char *, p, pName1, pName2, i )
    {
        if ( i == nOuts )
            break;
        sprintf( pBuffer, "%s_xor_%s", pName1, pName2 );
        Vec_PtrPush( pNew, Abc_UtilStrsav(pBuffer) );
    }
    Vec_PtrForEachEntryStart( char *, p, pName1, i, i )
        Vec_PtrPush( pNew, Abc_UtilStrsav(pName1) );
    return pNew;
}